

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O0

BOOL __thiscall
Memory::Recycler::FinishConcurrent<(Memory::CollectionFlags)270008320>(Recycler *this)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  undefined4 *puVar4;
  BOOL forceFinish;
  Recycler *this_local;
  
  BVar3 = CollectionInProgress(this);
  if (BVar3 != 0) {
    BVar3 = IsConcurrentEnabled(this);
    if (BVar3 == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                         ,0x11fe,"(this->IsConcurrentEnabled())","this->IsConcurrentEnabled()");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    BVar3 = IsConcurrentState(this);
    if (BVar3 == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                         ,0x11ff,"(IsConcurrentState())","IsConcurrentState()");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    BVar3 = IsConcurrentExecutingState(this);
    if (BVar3 == 0) {
      if (((DAT_01eca380 & 1) != 0) && (BVar3 = IsConcurrentSweepState(this), BVar3 != 0)) {
        HeapInfoManager::ZeroQueuedPages(&this->autoHeap);
        HeapInfoManager::FlushBackgroundPages(&this->autoHeap);
      }
      (this->collectionParam).finishOnly = true;
      (this->collectionParam).flags = FinishConcurrentDefault;
      this->skipStack = false;
      this->isFinishGCOnIdle = false;
      BVar3 = FinishConcurrentCollectWrapped(this,FinishConcurrentDefault);
      return BVar3;
    }
  }
  return 0;
}

Assistant:

BOOL
Recycler::FinishConcurrent()
{
    CompileAssert((flags & ~(CollectOverride_AllowDispose | CollectOverride_ForceFinish | CollectOverride_ForceInThread
        | CollectMode_Concurrent | CollectOverride_DisableIdleFinish | CollectOverride_BackgroundFinishMark
        | CollectOverride_SkipStack | CollectOverride_FinishConcurrentTimeout)) == 0);

    if (this->CollectionInProgress())
    {
        Assert(this->IsConcurrentEnabled());
        Assert(IsConcurrentState());

        const BOOL forceFinish = flags & CollectOverride_ForceFinish;

        if (forceFinish || !IsConcurrentExecutingState())
        {
#if ENABLE_BACKGROUND_PAGE_FREEING
            if (CONFIG_FLAG(EnableBGFreeZero))
            {
                if (this->IsConcurrentSweepState())
                {
                    // Help with the background thread to zero and flush zero pages
                    // if we are going to wait anyways.
                    autoHeap.ZeroQueuedPages();
                    autoHeap.FlushBackgroundPages();
                }
            }
#endif
#ifdef RECYCLER_TRACE
            collectionParam.finishOnly = true;
            collectionParam.flags = flags;
#endif
#if ENABLE_CONCURRENT_GC
            // If SkipStack is provided, and we're not forcing the finish (i.e we're not in concurrent executing state)
            // then, it's fine to set the skipStack flag to true, so that during the in-thread find-roots, we'll skip
            // the stack scan
            this->skipStack = ((flags & CollectOverride_SkipStack) != 0) && !forceFinish;
#if DBG
            this->isFinishGCOnIdle = (flags == FinishConcurrentOnIdleAtRoot);
#endif
#endif

            return FinishConcurrentCollectWrapped(flags);
        }
    }

    return false;
}